

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.h
# Opt level: O1

void TTD::SortDictIntoListOnNames<Js::FunctionBody*>
               (BaseDictionary<Js::FunctionBody_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *objToNameMap,
               List<Js::FunctionBody_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *sortedObjList,TTAutoString *nullString)

{
  Type pFVar1;
  List<Js::FunctionBody_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar2;
  int iVar3;
  Type *ppFVar4;
  TTAutoString *this;
  TTAutoString *this_00;
  char16 *string1;
  char16 *string2;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Type local_60;
  FunctionBody *temp;
  int local_4c;
  int local_48;
  int local_44;
  List<Js::FunctionBody_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_40;
  int local_34;
  
  local_40 = sortedObjList;
  if ((sortedObjList->super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>
      ).count != 0) {
    TTDAbort_unrecoverable_error("This should be empty.");
  }
  JsUtil::
  BaseDictionary<Js::FunctionBody_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  MapEntryUntil<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Common_DataStructures_BaseDictionary_h:587:34)>
            (objToNameMap,(anon_class_8_1_3fcf6586)sortedObjList);
  local_44 = (sortedObjList->
             super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>).count;
  lVar5 = 0;
  temp = (FunctionBody *)objToNameMap;
  do {
    iVar8 = (&DAT_010f7d90)[lVar5];
    if (iVar8 < local_44) {
      local_48 = 0;
      local_34 = iVar8;
      do {
        ppFVar4 = JsUtil::
                  List<Js::FunctionBody_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(local_40,iVar8);
        local_60 = *ppFVar4;
        this = JsUtil::
               BaseDictionary<Js::FunctionBody_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Item(objToNameMap,&local_60);
        iVar7 = local_48;
        iVar6 = iVar8;
        local_4c = iVar8;
        if (local_34 <= iVar8) {
          do {
            ppFVar4 = JsUtil::
                      List<Js::FunctionBody_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Item(local_40,iVar7);
            this_00 = JsUtil::
                      BaseDictionary<Js::FunctionBody_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ::Item((BaseDictionary<Js::FunctionBody_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                              *)temp,ppFVar4);
            string1 = UtilSupport::TTAutoString::GetStrValue(this_00);
            string2 = UtilSupport::TTAutoString::GetStrValue(this);
            iVar3 = PAL_wcscmp(string1,string2);
            pLVar2 = local_40;
            iVar6 = iVar8;
            if (iVar3 < 1) break;
            iVar6 = iVar8 - local_34;
            ppFVar4 = JsUtil::
                      List<Js::FunctionBody_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Item(local_40,iVar7);
            pFVar1 = *ppFVar4;
            iVar3 = iVar8 + 1;
            JsUtil::
            List<Js::FunctionBody_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(pLVar2,iVar3);
            (pLVar2->super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>)
            .buffer[iVar8] = pFVar1;
            iVar8 = (pLVar2->
                    super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>).
                    count;
            if (iVar3 < iVar8) {
              iVar3 = iVar8;
            }
            (pLVar2->super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>)
            .count = iVar3;
            iVar7 = iVar7 - local_34;
            iVar8 = iVar6;
          } while (local_34 <= iVar6);
        }
        pLVar2 = local_40;
        iVar7 = iVar6 + 1;
        JsUtil::
        List<Js::FunctionBody_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(local_40,iVar7);
        (pLVar2->super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>).
        buffer[iVar6] = local_60;
        iVar8 = (pLVar2->
                super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>).
                count;
        if (iVar7 < iVar8) {
          iVar7 = iVar8;
        }
        (pLVar2->super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>).
        count = iVar7;
        iVar8 = local_4c + 1;
        local_48 = local_48 + 1;
        objToNameMap = (BaseDictionary<Js::FunctionBody_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        *)temp;
      } while (iVar8 != local_44);
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 8) {
      return;
    }
  } while( true );
}

Assistant:

void SortDictIntoListOnNames(const JsUtil::BaseDictionary<T, UtilSupport::TTAutoString*, HeapAllocator>& objToNameMap, JsUtil::List<T, HeapAllocator>& sortedObjList, const UtilSupport::TTAutoString& nullString)
    {
        TTDAssert(sortedObjList.Count() == 0, "This should be empty.");

        objToNameMap.Map([&](T key, UtilSupport::TTAutoString* value)
        {
            sortedObjList.Add(key);
        });

        //now sort the list so the traversal order is stable
        //Rock a custom shell sort!!!!
        const int32 gaps[8] = { 701, 301, 132, 57, 23, 10, 4, 1 };

        int32 llen = sortedObjList.Count();
        for(uint32 gapi = 0; gapi < 8; ++gapi)
        {
            int32 gap = gaps[gapi];

            for(int32 i = gap; i < llen; i++)
            {
                T temp = sortedObjList.Item(i);
                const UtilSupport::TTAutoString* tempStr = objToNameMap.Item(temp);

                int32 j = 0;
                for(j = i; j >= gap && (wcscmp(objToNameMap.Item(sortedObjList.Item(j - gap))->GetStrValue(), tempStr->GetStrValue()) > 0); j -= gap)
                {
                    T shiftElem = sortedObjList.Item(j - gap);
                    sortedObjList.SetItem(j, shiftElem);
                }

                sortedObjList.SetItem(j, temp);
            }
        }
    }